

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O1

DomainInsideSignature * __thiscall
TasGrid::TasmanianSparseGrid::getDomainInside
          (DomainInsideSignature *__return_storage_ptr__,TasmanianSparseGrid *this)

{
  long *plVar1;
  char cVar2;
  uint uVar3;
  code *pcVar4;
  long lVar5;
  
  uVar3 = TasGrid::TasmanianSparseGrid::getRule();
  if ((uVar3 & 0xfffffffe) == 0x20) {
    if (*(long *)(this + 0x10) == *(long *)(this + 0x18)) {
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      __return_storage_ptr__->_M_invoker =
           std::
           _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1965:24)>
           ::_M_invoke;
      pcVar4 = std::
               _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1965:24)>
               ::_M_manager;
    }
    else {
      if (*(long *)(this + 8) == 0) {
        lVar5 = 0;
      }
      else {
        lVar5 = (long)*(int *)(*(long *)(this + 8) + 0x10);
      }
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(long *)&(__return_storage_ptr__->super__Function_base)._M_functor = lVar5;
      *(TasmanianSparseGrid **)
       ((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = this;
      __return_storage_ptr__->_M_invoker =
           std::
           _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1971:24)>
           ::_M_invoke;
      pcVar4 = std::
               _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1971:24)>
               ::_M_manager;
    }
  }
  else if ((uVar3 & 0xfffffffe) == 0x22) {
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    __return_storage_ptr__->_M_invoker =
         std::
         _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1962:20)>
         ::_M_invoke;
    pcVar4 = std::
             _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1962:20)>
             ::_M_manager;
  }
  else {
    plVar1 = *(long **)(this + 8);
    if (*(long *)(this + 0x10) == *(long *)(this + 0x18)) {
      if (plVar1 != (long *)0x0) {
        cVar2 = (**(code **)(*plVar1 + 0x30))();
        if (cVar2 != '\0') {
          *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
          __return_storage_ptr__->_M_invoker =
               std::
               _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1979:28)>
               ::_M_invoke;
          pcVar4 = std::
                   _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1979:28)>
                   ::_M_manager;
          goto LAB_00112cfc;
        }
      }
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      __return_storage_ptr__->_M_invoker =
           std::
           _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1984:28)>
           ::_M_invoke;
      pcVar4 = std::
               _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1984:28)>
               ::_M_manager;
    }
    else {
      if (plVar1 == (long *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = (long)(int)plVar1[2];
      }
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(long *)&(__return_storage_ptr__->super__Function_base)._M_functor = lVar5;
      *(TasmanianSparseGrid **)
       ((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = this;
      __return_storage_ptr__->_M_invoker =
           std::
           _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1991:24)>
           ::_M_invoke;
      pcVar4 = std::
               _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/TasmanianSparseGrid.hpp:1991:24)>
               ::_M_manager;
    }
  }
LAB_00112cfc:
  (__return_storage_ptr__->super__Function_base)._M_manager = pcVar4;
  return __return_storage_ptr__;
}

Assistant:

DomainInsideSignature getDomainInside() const{
        auto rule = getRule();
        if ((rule == TasGrid::rule_gausshermite) || (rule == TasGrid::rule_gausshermiteodd)){ // unbounded domain
            return [](std::vector<double> const &)->bool{ return true; };
        }else if ((rule == TasGrid::rule_gausslaguerre) || (rule == TasGrid::rule_gausslaguerreodd)){ // bounded from below
            if (domain_transform_a.empty()){
                return [](std::vector<double> const &x)->bool{
                    for(auto const &v : x) if (v < 0.0) return false;
                    return true;
                };
            }else{
                size_t dims = (size_t) getNumDimensions();
                return [=](std::vector<double> const &x)->bool{
                    for(size_t i=0; i<dims; i++) if (x[i] < domain_transform_a[i]) return false;
                    return true;
                };
            }
        }else{
            if (domain_transform_a.empty()){
                if (isFourier()){
                    return [](std::vector<double> const &x)->bool{
                        for(auto const &v : x) if ((v < 0.0) || (v > 1.0)) return false;
                        return true;
                    };
                }else{
                    return [](std::vector<double> const &x)->bool{
                        for(auto const &v : x) if ((v < -1.0) || (v > 1.0)) return false;
                        return true;
                    };
                }
            }else{
                size_t dims = (size_t) getNumDimensions();
                return [=](std::vector<double> const &x)->bool{
                    for(size_t i=0; i<dims; i++)
                        if ((x[i] < domain_transform_a[i]) || (x[i] > domain_transform_b[i])) return false;
                    return true;
                };
            }
        }
    }